

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O1

void __thiscall
icu_63::Package::enumDependencies(Package *this,Item *pItem,void *context,CheckDependency *check)

{
  FILE *__stream;
  int32_t i;
  int iVar1;
  uint32_t uVar2;
  UDataInfo *pUVar3;
  long lVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  int *suffix;
  UDataSwapper *ds;
  Item *item;
  undefined8 extraout_RAX;
  int *piVar8;
  int32_t iVar9;
  int *piVar10;
  uint uVar11;
  int *__s;
  ulong uVar12;
  Package *this_00;
  uint uVar13;
  uint32_t *puVar14;
  byte *pbVar15;
  UErrorCode *pErrorCode;
  UErrorCode *in_stack_fffffffffffffe48;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  char *local_1a8;
  int32_t infoLength;
  NativeItem nativePool;
  ResourceData resData;
  NativeItem nrb;
  char target [200];
  
  errorCode = U_ZERO_ERROR;
  pUVar3 = getDataInfo(pItem->data,pItem->length,&infoLength,&itemHeaderLength,&errorCode);
  if (U_ZERO_ERROR < errorCode) {
    return;
  }
  piVar8 = &dataFormats;
  lVar4 = 0;
  do {
    if (*piVar8 == *(int *)pUVar3->dataFormat) goto LAB_001e8ece;
    lVar4 = lVar4 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar4 != 3);
  lVar4 = 0xffffffff;
LAB_001e8ece:
  iVar1 = (int)lVar4;
  if (iVar1 < 0) {
    return;
  }
  if (iVar1 != 1) {
    if (iVar1 != 0) goto LAB_001e9223;
    nrb.swapped = (uint8_t *)0x0;
    NativeItem::setItem(&nrb,pItem,ures_swap_63);
    piVar8 = (int *)pItem->name;
    pErrorCode = (UErrorCode *)0x1e8f2e;
    res_read_63(&resData,nrb.pInfo,nrb.bytes,nrb.length,&errorCode);
    this_00 = (Package *)nrb.pInfo;
    if (U_ZERO_ERROR < errorCode) goto LAB_001e93e1;
    if (((1 < (nrb.pInfo)->formatVersion[0]) ||
        (((nrb.pInfo)->formatVersion[0] == 1 && ((nrb.pInfo)->formatVersion[1] != '\0')))) &&
       (resData.noFallback == '\0')) {
      pcVar5 = strrchr((char *)piVar8,0x2f);
      __s = (int *)(pcVar5 + 1);
      if (pcVar5 == (char *)0x0) {
        __s = piVar8;
      }
      pErrorCode = (UErrorCode *)0x1e8f82;
      piVar6 = (int *)strrchr((char *)__s,0x2e);
      suffix = piVar6;
      if (piVar6 == (int *)0x0) {
        pErrorCode = (UErrorCode *)0x1e8f8f;
        sVar7 = strlen((char *)__s);
        piVar6 = (int *)(sVar7 + (long)__s);
        suffix = piVar6;
      }
      do {
        piVar10 = piVar6;
        if (piVar6 <= __s) break;
        piVar10 = (int *)((long)piVar6 + -1);
        pcVar5 = (char *)((long)piVar6 + -1);
        piVar6 = piVar10;
      } while (*pcVar5 != '_');
      if (piVar10 == __s) {
        iVar9 = 4;
        pcVar5 = "root";
        if (((long)suffix - (long)__s == 4) && (*__s == 0x746f6f72)) goto LAB_001e90e4;
      }
      else {
        iVar9 = (int)piVar10 - (int)__s;
        pcVar5 = (char *)__s;
      }
      pErrorCode = (UErrorCode *)0x1e90ce;
      makeTargetName((char *)piVar8,pcVar5,iVar9,(char *)suffix,target,(int32_t)&errorCode,
                     in_stack_fffffffffffffe48);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        pErrorCode = (UErrorCode *)0x1e90e4;
        (*check)(context,(char *)piVar8,target);
      }
    }
LAB_001e90e4:
    nativePool.bytes = (uint8_t *)0x0;
    nativePool.swapped = (uint8_t *)0x0;
    nativePool.pItem = (Item *)0x0;
    nativePool.pInfo = (UDataInfo *)0x0;
    nativePool.length = 0;
    if (resData.usesPoolBundle == '\0') {
LAB_001e91dd:
      ures_enumDependencies
                ((char *)piVar8,&resData,resData.rootRes,(char *)0x0,(char *)0x0,0,check,context,
                 (Package *)&errorCode,pErrorCode);
    }
    else {
      makeTargetName((char *)piVar8,"pool",4,".res",target,(int32_t)&errorCode,
                     in_stack_fffffffffffffe48);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        (*check)(context,(char *)piVar8,target);
        iVar9 = findItem(this,target,-1);
        if (-1 < iVar9) {
          item = getItem(this,iVar9);
          pErrorCode = (UErrorCode *)0x1e9187;
          NativeItem::setItem(&nativePool,item,ures_swap_63);
          if ((((nativePool.pInfo)->formatVersion[0] < 2) || (nativePool.bytes[4] < 8)) ||
             ((nativePool.bytes[0x18] & 2) == 0)) {
            fprintf(_stderr,"icupkg: %s is not a pool bundle\n",target);
          }
          else {
            if (resData.pRoot[8] == *(int *)(nativePool.bytes + 0x20)) {
              resData.poolBundleKeys =
                   (char *)(nativePool.bytes + (ulong)nativePool.bytes[4] * 4 + 4);
              resData.poolBundleStrings =
                   (uint16_t *)(nativePool.bytes + (long)*(int *)(nativePool.bytes + 8) * 4);
              goto LAB_001e91dd;
            }
            fprintf(_stderr,"icupkg: %s has mismatched checksum for %s\n",target,piVar8);
          }
        }
      }
    }
    if (nativePool.swapped != (uint8_t *)0x0) {
      operator_delete__(nativePool.swapped);
    }
    if (nrb.swapped != (uint8_t *)0x0) {
      operator_delete__(nrb.swapped);
    }
    goto LAB_001e9223;
  }
  this_00 = (Package *)&errorCode;
  ds = udata_openSwapper_63
                 (pUVar3->isBigEndian,pUVar3->charsetFamily,'\0','\0',(UErrorCode *)this_00);
  if (U_ZERO_ERROR < errorCode) {
    enumDependencies();
LAB_001e93e1:
    enumDependencies(this_00);
    if (nativePool.swapped != (uint8_t *)0x0) {
      operator_delete__(nativePool.swapped);
    }
    if (nrb.swapped != (uint8_t *)0x0) {
      operator_delete__(nrb.swapped);
    }
    _Unwind_Resume(extraout_RAX);
  }
  ds->printError = printError;
  __stream = _stderr;
  ds->printErrorContext = _stderr;
  if ((pUVar3->formatVersion[0] != 6) || (pUVar3->formatVersion[1] < 2)) {
    fprintf(__stream,"icupkg/ucnv_enumDependencies(): .cnv format version %02x.%02x not supported\n"
            ,(ulong)pUVar3->formatVersion[0],(ulong)pUVar3->formatVersion[1]);
    exit(0x10);
  }
  uVar11 = pItem->length - itemHeaderLength;
  if ((int)uVar11 < 100) {
LAB_001e903b:
    pcVar5 = 
    "icupkg/ucnv_enumDependencies(): too few bytes (%d after header) for an ICU .cnv conversion table\n"
    ;
    uVar13 = uVar11;
LAB_001e9047:
    udata_printError_63(ds,pcVar5,(ulong)uVar13);
    errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    puVar14 = (uint32_t *)(pItem->data + itemHeaderLength);
    local_1a8 = pItem->name;
    uVar2 = (*ds->readUInt32)(*puVar14);
    uVar13 = uVar11 - uVar2;
    if (uVar11 < uVar2) goto LAB_001e903b;
    if (*(char *)((long)puVar14 + 0x45) != '\x02') goto LAB_001e9056;
    if ((int)uVar13 < 0x28) {
      pcVar5 = 
      "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
      ;
      goto LAB_001e9047;
    }
    pbVar15 = (byte *)((long)puVar14 + (ulong)uVar2);
    if (*pbVar15 == 5) {
      if ((2 < pbVar15[1]) &&
         (uVar2 = (*ds->readUInt32)(*(uint32_t *)(pbVar15 + 0x20)), (uVar2 & 0xff80) == 0)) {
        uVar12 = (ulong)((uVar2 & 0x3f) << 2);
        goto LAB_001e92fa;
      }
LAB_001e927f:
      udata_printError_63(ds,
                          "icupkg/ucnv_enumDependencies(): unsupported _MBCSHeader.version %d.%d\n",
                          (ulong)*pbVar15,(ulong)pbVar15[1]);
LAB_001e929a:
      errorCode = U_UNSUPPORTED_ERROR;
    }
    else {
      if ((*pbVar15 != 4) || (uVar12 = 0x20, pbVar15[1] == 0)) goto LAB_001e927f;
LAB_001e92fa:
      uVar2 = (*ds->readUInt32)(*(uint32_t *)(pbVar15 + 0x18));
      if ((char)uVar2 == '\x0e') {
        if ((int)uVar13 < (int)((uVar2 >> 8) + 0x80)) {
          pcVar5 = 
          "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
          ;
          goto LAB_001e9047;
        }
        sVar7 = strlen((char *)(pbVar15 + uVar12));
        if ((int)sVar7 < 0x20) {
          (*ds->swapInvChars)(ds,pbVar15 + uVar12,(int)sVar7 + 1,&resData,&errorCode);
          pcVar5 = local_1a8;
          makeTargetName(local_1a8,(char *)&resData,-1,".cnv",target,(int32_t)&errorCode,
                         in_stack_fffffffffffffe48);
          if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            (*check)(context,pcVar5,target);
          }
          goto LAB_001e9056;
        }
        udata_printError_63(ds,"icupkg/ucnv_enumDependencies(%s): base name length %ld too long\n",
                            local_1a8,sVar7 & 0xffffffff);
        goto LAB_001e929a;
      }
    }
  }
LAB_001e9056:
  udata_closeSwapper_63(ds);
LAB_001e9223:
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  exit(errorCode);
}

Assistant:

void
Package::enumDependencies(Item *pItem, void *context, CheckDependency check) {
    int32_t infoLength, itemHeaderLength;
    UErrorCode errorCode=U_ZERO_ERROR;
    const UDataInfo *pInfo=getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
    if(U_FAILURE(errorCode)) {
        return; // should not occur because readFile() checks headers
    }

    // find the data format and call the corresponding function, if any
    int32_t format=getDataFormat(pInfo->dataFormat);
    if(format>=0) {
        switch(format) {
        case FMT_RES:
            {
                /*
                 * Swap the resource bundle (if necessary) so that we can use
                 * the normal runtime uresdata.c code to read it.
                 * We do not want to duplicate that code, especially not together with on-the-fly swapping.
                 */
                NativeItem nrb(pItem, ures_swap);
                ures_enumDependencies(pItem->name, nrb.getDataInfo(), nrb.getBytes(), nrb.getLength(), check, context, this, &errorCode);
                break;
            }
        case FMT_CNV:
            {
                // TODO: share/cache swappers
                UDataSwapper *ds=udata_openSwapper(
                                    (UBool)pInfo->isBigEndian, pInfo->charsetFamily,
                                    U_IS_BIG_ENDIAN, U_CHARSET_FAMILY,
                                    &errorCode);
                if(U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                            pItem->name, u_errorName(errorCode));
                    exit(errorCode);
                }

                ds->printError=printError;
                ds->printErrorContext=stderr;

                const uint8_t *inBytes=pItem->data+itemHeaderLength;
                int32_t length=pItem->length-itemHeaderLength;

                ucnv_enumDependencies(ds, pItem->name, pInfo, inBytes, length, check, context, &errorCode);
                udata_closeSwapper(ds);
                break;
            }
        default:
            break;
        }

        if(U_FAILURE(errorCode)) {
            exit(errorCode);
        }
    }
}